

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O1

int nn_node_unsubscribe(nn_trie_node **self,uint8_t *data,size_t size)

{
  uint16_t *puVar1;
  byte bVar2;
  ushort uVar3;
  byte bVar4;
  uint32_t uVar5;
  int iVar6;
  uint uVar7;
  nn_trie_node *pnVar8;
  nn_trie_node **self_00;
  nn_trie_node *pnVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  long *plVar15;
  size_t size_00;
  byte *pbVar16;
  ulong uVar17;
  
  if (size != 0) {
    pnVar8 = *self;
    bVar4 = pnVar8->prefix_len;
    uVar12 = (ulong)(uint)bVar4;
    uVar13 = (uint)bVar4;
    if (bVar4 != 0) {
      uVar12 = 0;
      do {
        if (size == uVar12) {
          uVar12 = size & 0xffffffff;
          goto LAB_0011463f;
        }
        if (pnVar8->prefix[uVar12] != data[uVar12]) goto LAB_0011463f;
        uVar12 = uVar12 + 1;
      } while (bVar4 != uVar12);
      uVar12 = (ulong)uVar13;
    }
LAB_0011463f:
    if ((uint)uVar12 != uVar13) {
      return 0;
    }
    uVar12 = (ulong)uVar13;
    if (uVar12 != size) {
      pbVar16 = data + uVar12;
      self_00 = nn_node_next(pnVar8,*pbVar16);
      if (self_00 == (nn_trie_node **)0x0) {
        return 0;
      }
      iVar6 = nn_node_unsubscribe(self_00,pbVar16 + 1,~uVar12 + size);
      if (iVar6 == 0) {
        return 0;
      }
      if (*self_00 != (nn_trie_node *)0x0) {
        return 1;
      }
      pnVar8 = *self;
      bVar4 = pnVar8->type;
      if (bVar4 < 9) {
        uVar13 = (uint)bVar4;
        if (bVar4 == 0) {
          uVar12 = 0;
        }
        else {
          uVar12 = 0;
          do {
            if (pnVar8->prefix[uVar12 + 10] == *pbVar16) goto LAB_001147d7;
            uVar12 = uVar12 + 1;
          } while (uVar13 != uVar12);
          uVar12 = (ulong)uVar13;
        }
LAB_001147d7:
        uVar17 = uVar12 & 0xffffffff;
        memmove(pnVar8->prefix + uVar17 + 10,pnVar8->prefix + uVar17 + 0xb,
                (long)(int)(uVar13 + ~(uint)uVar12));
        pnVar8 = *self;
        memmove(pnVar8[1].prefix + uVar17 * 8 + -6,pnVar8[1].prefix + uVar17 * 8 + 2,
                ((long)(int)~(uint)uVar12 + (ulong)pnVar8->type) * 8);
        pnVar8 = *self;
        bVar4 = pnVar8->type - 1;
        pnVar8->type = bVar4;
        pnVar8 = (nn_trie_node *)nn_realloc(pnVar8,(ulong)bVar4 * 8 + 0x18);
        *self = pnVar8;
        if ((pnVar8->type == '\0') && (pnVar8->refcount == 0)) {
          nn_free(pnVar8);
          *self = (nn_trie_node *)0x0;
          return 1;
        }
        pnVar8 = nn_node_compact(pnVar8);
      }
      else {
        uVar3 = (pnVar8->u).dense.nbr;
        if (uVar3 < 10) {
          pnVar9 = (nn_trie_node *)nn_alloc_(0x58);
          pnVar9->refcount = 0;
          pnVar8 = *self;
          bVar4 = pnVar8->prefix_len;
          pnVar9->prefix_len = bVar4;
          memcpy(pnVar9->prefix,pnVar8->prefix,(ulong)bVar4);
          pnVar9->type = '\b';
          pnVar8 = *self;
          bVar4 = (pnVar8->u).sparse.children[0];
          uVar13 = (uint)bVar4;
          if ((pnVar8->u).sparse.children[1] + 1 != (uint)bVar4) {
            uVar12 = 0;
            iVar6 = 0;
            do {
              lVar14 = *(long *)(pnVar8[1].prefix + uVar12 * 8 + -6);
              if (lVar14 != 0) {
                pnVar9->prefix[(long)iVar6 + 10] = (char)uVar13 + (char)uVar12;
                *(long *)(pnVar9[1].prefix + (long)iVar6 * 8 + -6) = lVar14;
                iVar6 = iVar6 + 1;
              }
              uVar12 = uVar12 + 1;
              pnVar8 = *self;
              uVar13 = (uint)(pnVar8->u).sparse.children[0];
            } while (uVar12 != ((pnVar8->u).sparse.children[1] - uVar13) + 1);
          }
          nn_free(pnVar8);
          *self = pnVar9;
          return 1;
        }
        bVar4 = (pnVar8->u).sparse.children[0];
        uVar12 = (ulong)bVar4;
        uVar13 = (uint)bVar4;
        if (*pbVar16 == bVar4) {
          uVar7 = (uint)(pnVar8->u).sparse.children[1];
          uVar10 = uVar7 - uVar13;
          if (uVar10 == 0xffffffff) {
            uVar11 = 0;
          }
          else {
            uVar11 = uVar10 + 1;
            lVar14 = 0;
            do {
              if (*(long *)(pnVar8[1].prefix + lVar14 * 8 + -6) != 0) {
                uVar11 = (uint)lVar14;
                break;
              }
              lVar14 = lVar14 + 1;
            } while ((ulong)uVar10 + 1 != lVar14);
          }
          iVar6 = uVar13 + uVar11;
          memmove(pnVar8 + 1,pnVar8[1].prefix + (ulong)uVar11 * 8 + -6,
                  (long)(int)((uVar7 - iVar6) + 1) << 3);
          ((*self)->u).sparse.children[0] = (uint8_t)iVar6;
          puVar1 = &((*self)->u).dense.nbr;
          *puVar1 = *puVar1 - 1;
          pnVar8 = *self;
          size_00 = (long)(int)(((uint)(pnVar8->u).sparse.children[1] - iVar6) + 1) * 8 + 0x18;
        }
        else {
          bVar2 = (pnVar8->u).sparse.children[1];
          if (*pbVar16 != bVar2) {
            (pnVar8->u).dense.nbr = uVar3 - 1;
            return 1;
          }
          uVar7 = (uint)bVar2;
          iVar6 = uVar7 - uVar13;
          if (iVar6 != 0) {
            plVar15 = (long *)((long)pnVar8 + ((ulong)uVar7 * 8 - (ulong)((uint)bVar4 * 8)) + 0x18);
            do {
              if (*plVar15 != 0) {
                iVar6 = uVar7 - (int)uVar12;
                goto LAB_0011490d;
              }
              uVar12 = uVar12 + 1;
              plVar15 = plVar15 + -1;
            } while (uVar7 != uVar12);
            iVar6 = 0;
          }
LAB_0011490d:
          (pnVar8->u).sparse.children[1] = (char)iVar6 + bVar4;
          puVar1 = &((*self)->u).dense.nbr;
          *puVar1 = *puVar1 - 1;
          pnVar8 = *self;
          size_00 = ((ulong)(pnVar8->u).sparse.children[1] - (ulong)(pnVar8->u).sparse.children[0])
                    * 8 + 0x20;
        }
        pnVar8 = (nn_trie_node *)nn_realloc(pnVar8,size_00);
      }
      *self = pnVar8;
      return 1;
    }
  }
  pnVar8 = *self;
  iVar6 = -0x16;
  if ((pnVar8 != (nn_trie_node *)0x0) && (pnVar8->refcount != 0)) {
    iVar6 = 0;
    uVar5 = pnVar8->refcount - 1;
    pnVar8->refcount = uVar5;
    if (uVar5 == 0) {
      iVar6 = 1;
      if (pnVar8->type == '\0') {
        nn_free(pnVar8);
        *self = (nn_trie_node *)0x0;
      }
      else {
        pnVar8 = nn_node_compact(pnVar8);
        *self = pnVar8;
      }
    }
  }
  return iVar6;
}

Assistant:

static int nn_node_unsubscribe (struct nn_trie_node **self,
    const uint8_t *data, size_t size)
{
    int i;
    int j;
    int index;
    int new_min;
    struct nn_trie_node **ch;
    struct nn_trie_node *new_node;
    struct nn_trie_node *ch2;

    if (!size)
        goto found;

    /*  If prefix does not match the data, return. */
    if (nn_node_check_prefix (*self, data, size) != (*self)->prefix_len)
        return 0;

    /*  Skip the prefix. */
    data += (*self)->prefix_len;
    size -= (*self)->prefix_len;

    if (!size)
        goto found;

    /*  Move to the next node. */
    ch = nn_node_next (*self, *data);
    if (!ch)
        return 0; /*  TODO: This should be an error. */

    /*  Recursive traversal of the trie happens here. If the subscription
        wasn't really removed, nothing have changed in the trie and
        no additional pruning is needed. */
    if (nn_node_unsubscribe (ch, data + 1, size - 1) == 0)
        return 0;

    /*  Subscription removal is already done. Now we are going to compact
        the trie. However, if the following node remains in place, there's
        nothing to compact here. */
    if (*ch)
        return 1;

    /*  Sparse array. */
    if ((*self)->type < NN_TRIE_DENSE_TYPE) {

        /*  Get the indices of the removed child. */
        for (index = 0; index != (*self)->type; ++index)
            if ((*self)->u.sparse.children [index] == *data)
                break;
        assert (index != (*self)->type);

        /*  Remove the destroyed child from both lists of children. */
        memmove (
            (*self)->u.sparse.children + index,
            (*self)->u.sparse.children + index + 1,
            (*self)->type - index - 1);
        memmove (
            nn_node_child (*self, index),
            nn_node_child (*self, index + 1),
            ((*self)->type - index - 1) * sizeof (struct nn_trie_node*));
        --(*self)->type;
        *self = nn_realloc (*self, sizeof (struct nn_trie_node) +
            ((*self)->type * sizeof (struct nn_trie_node*)));
        assert (*self);
        
        /*  If there are no more children and no refcount, we can delete
            the node altogether. */
        if (!(*self)->type && !nn_node_has_subscribers (*self)) {
            nn_free (*self);
            *self = NULL;
            return 1;
        }

        /*  Try to merge the node with the following node. */
        *self = nn_node_compact (*self);

        return 1;
    }

    /*  Dense array. */

    /*  In this case the array stays dense. We have to adjust the limits of
        the array, if appropriate. */
    if ((*self)->u.dense.nbr > NN_TRIE_SPARSE_MAX + 1) {

        /*  If the removed item is the leftmost one, trim the array from
            the left side. */
        if (*data == (*self)->u.dense.min) {
             for (i = 0; i != (*self)->u.dense.max - (*self)->u.dense.min + 1;
                   ++i)
                 if (*nn_node_child (*self, i))
                     break;
             new_min = i + (*self)->u.dense.min;
             memmove (nn_node_child (*self, 0), nn_node_child (*self, i),
                 ((*self)->u.dense.max - new_min + 1) *
                 sizeof (struct nn_trie_node*));
             (*self)->u.dense.min = new_min;
             --(*self)->u.dense.nbr;
             *self = nn_realloc (*self, sizeof (struct nn_trie_node) +
                 ((*self)->u.dense.max - new_min + 1) *
                 sizeof (struct nn_trie_node*));
             assert (*self);
             return 1;
        }

        /*  If the removed item is the rightmost one, trim the array from
            the right side. */
        if (*data == (*self)->u.dense.max) {
             for (i = (*self)->u.dense.max - (*self)->u.dense.min; i != 0; --i)
                 if (*nn_node_child (*self, i))
                     break;
             (*self)->u.dense.max = i + (*self)->u.dense.min;
             --(*self)->u.dense.nbr;
             *self = nn_realloc (*self, sizeof (struct nn_trie_node) +
                 ((*self)->u.dense.max - (*self)->u.dense.min + 1) *
                 sizeof (struct nn_trie_node*));
             assert (*self);
             return 1;
        }

        /*  If the item is removed from the middle of the array, do nothing. */
        --(*self)->u.dense.nbr;
        return 1;
    }

    /*  Convert dense array into sparse array. */
    {
        new_node = nn_alloc (sizeof (struct nn_trie_node) +
            NN_TRIE_SPARSE_MAX * sizeof (struct nn_trie_node*), "trie node");
        assert (new_node);
        new_node->refcount = 0;
        new_node->prefix_len = (*self)->prefix_len;
        memcpy (new_node->prefix, (*self)->prefix, new_node->prefix_len);
        new_node->type = NN_TRIE_SPARSE_MAX;
        j = 0;
        for (i = 0; i != (*self)->u.dense.max - (*self)->u.dense.min + 1;
              ++i) {
            ch2 = *nn_node_child (*self, i);
            if (ch2) {
                new_node->u.sparse.children [j] = i + (*self)->u.dense.min;
                *nn_node_child (new_node, j) = ch2;
                ++j;
            }
        }
        assert (j == NN_TRIE_SPARSE_MAX);
        nn_free (*self);
        *self = new_node;
        return 1;
    }

found:

    /*  We are at the end of the subscription here. */

    /*  Subscription doesn't exist. */
    if (nn_slow (!*self || !nn_node_has_subscribers (*self)))
        return -EINVAL;

    /*  Subscription exists. Unsubscribe. */
    --(*self)->refcount;

    /*  If reference count has dropped to zero we can try to compact
        the node. */
    if (!(*self)->refcount) {

        /*  If there are no children, we can delete the node altogether. */
        if (!(*self)->type) {
            nn_free (*self);
            *self = NULL;
            return 1;
        }

        /*  Try to merge the node with the following node. */
        *self = nn_node_compact (*self);
        return 1;
    }

    return 0;
}